

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Abc_Cex_t * Saig_BmcGenerateCounterExample(Saig_Bmc_t *p)

{
  uint ivar;
  int iVar1;
  Abc_Cex_t *p_00;
  Aig_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->iFrameFail + 1);
  iVar3 = p->iFrameFail;
  p_00->iFrame = iVar3;
  p_00->iPo = p->iOutputFail;
  i = 0;
  do {
    if (iVar3 < i) {
      iVar3 = Saig_ManVerifyCex(p->pAig,p_00);
      if (iVar3 == 0) {
        puts("Saig_BmcGenerateCounterExample(): Counter-example is invalid.");
        Abc_CexFree(p_00);
        p_00 = (Abc_Cex_t *)0x0;
      }
      return p_00;
    }
    for (iVar3 = 0; iVar3 < p->pAig->nTruePis; iVar3 = iVar3 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iVar3);
      pAVar2 = Saig_BmcObjFrame(p,pAVar2,i);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (ivar = Saig_BmcSatNum(p,pAVar2), ivar != 0)) {
        if (p->pSat2 == (satoko_t *)0x0) {
          if (((int)ivar < 0) || (p->pSat->size <= (int)ivar)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (p->pSat->model[ivar] == 1) goto LAB_00472f3f;
        }
        else {
          iVar1 = satoko_read_cex_varvalue(p->pSat2,ivar);
          if (iVar1 != 0) {
LAB_00472f3f:
            iVar1 = p->pAig->nTruePis * i + p_00->nRegs + iVar3;
            (&p_00[1].iPo)[iVar1 >> 5] = (&p_00[1].iPo)[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
          }
        }
      }
    }
    i = i + 1;
    iVar3 = p->iFrameFail;
  } while( true );
}

Assistant:

Abc_Cex_t * Saig_BmcGenerateCounterExample( Saig_Bmc_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj, * pObjFrm;
    int i, f, iVarNum;
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), p->iFrameFail+1 );
    pCex->iFrame = p->iFrameFail;
    pCex->iPo    = p->iOutputFail;
    // copy the bit data
    for ( f = 0; f <= p->iFrameFail; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrm = Saig_BmcObjFrame( p, pObj, f );
            if ( pObjFrm == NULL )
                continue;
            iVarNum = Saig_BmcSatNum( p, pObjFrm );
            if ( iVarNum == 0 )
                continue;
            if ( p->pSat2 ? satoko_read_cex_varvalue(p->pSat2, iVarNum) : sat_solver_var_value(p->pSat, iVarNum) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + Saig_ManPiNum(p->pAig) * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}